

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContextExtenderAdapter.h
# Opt level: O0

EStatusCode __thiscall
DocumentContextExtenderAdapter::OnFormXObjectWrite
          (DocumentContextExtenderAdapter *this,ObjectIDType inFormXObjectID,
          ObjectIDType inFormXObjectResourcesDictionaryID,DictionaryContext *inFormDictionaryContext
          ,ObjectsContext *inPDFWriterObjectContext,DocumentContext *inDocumentContext)

{
  DocumentContext *inDocumentContext_local;
  ObjectsContext *inPDFWriterObjectContext_local;
  DictionaryContext *inFormDictionaryContext_local;
  ObjectIDType inFormXObjectResourcesDictionaryID_local;
  ObjectIDType inFormXObjectID_local;
  DocumentContextExtenderAdapter *this_local;
  
  return eSuccess;
}

Assistant:

virtual PDFHummus::EStatusCode OnFormXObjectWrite(
							ObjectIDType inFormXObjectID,
							ObjectIDType inFormXObjectResourcesDictionaryID,
							DictionaryContext* inFormDictionaryContext,
							ObjectsContext* inPDFWriterObjectContext,
							PDFHummus::DocumentContext* inDocumentContext){
	  (void) inFormXObjectID;
	  (void) inFormXObjectResourcesDictionaryID;
	  (void) inFormDictionaryContext;
	  (void) inPDFWriterObjectContext;
	  (void) inDocumentContext;
	  return PDFHummus::eSuccess;}